

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall ExpressionContext::HideFunction(ExpressionContext *this,FunctionData *function)

{
  SmallArray<FunctionData_*,_2U> *this_00;
  char *pcVar1;
  FunctionData *pFVar2;
  ScopeData *pSVar3;
  FunctionData **ppFVar4;
  uint i;
  uint index;
  
  pcVar1 = (function->name->name).begin;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '$')) {
    pSVar3 = this->scope;
    if ((pSVar3->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
      pSVar3 = this->globalScope;
    }
    DirectChainedMap<IdentifierLookupResult>::remove
              (&pSVar3->idLookupMap,(char *)(ulong)function->nameHash);
  }
  pSVar3 = function->scope;
  this_00 = &pSVar3->functions;
  for (index = 0; index < (pSVar3->functions).count; index = index + 1) {
    ppFVar4 = SmallArray<FunctionData_*,_2U>::operator[](this_00,index);
    if (*ppFVar4 == function) {
      ppFVar4 = SmallArray<FunctionData_*,_2U>::back(this_00);
      pFVar2 = *ppFVar4;
      ppFVar4 = SmallArray<FunctionData_*,_2U>::operator[](this_00,index);
      *ppFVar4 = pFVar2;
      SmallArray<FunctionData_*,_2U>::pop_back(this_00);
    }
  }
  return;
}

Assistant:

void ExpressionContext::HideFunction(FunctionData *function)
{
	// Don't have to remove internal functions since they are never added to lookup
	if(function->name->name.begin && *function->name->name.begin != '$')
	{
		if(scope->type == SCOPE_TYPE || scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	SmallArray<FunctionData*, 2> &scopeFunctions = function->scope->functions;

	for(unsigned i = 0; i < scopeFunctions.size(); i++)
	{
		if(scopeFunctions[i] == function)
		{
			scopeFunctions[i] = scopeFunctions.back();
			scopeFunctions.pop_back();
		}
	}
}